

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O3

wchar_t file_close2(archive *a,void *client_data)

{
  uint uVar1;
  wchar_t extraout_EAX;
  ssize_t sVar2;
  
  if (-1 < (int)a->magic) {
    uVar1 = *(uint *)&a->archive_format_name & 0xf000;
    if (((uVar1 != 0x2000) && (uVar1 != 0x6000)) && (uVar1 != 0x8000)) {
      do {
        sVar2 = read(a->magic,*(void **)&a->archive_format,(size_t)a->vtable);
      } while (0 < sVar2);
    }
    if (*(int *)((long)&a->error + 4) != 0) {
      close(a->magic);
    }
  }
  free(*(void **)&a->archive_format);
  *(undefined8 *)&a->archive_format = 0;
  a->magic = 0xffffffff;
  return extraout_EAX;
}

Assistant:

static int
file_close2(struct archive *a, void *client_data)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;

	(void)a; /* UNUSED */

	/* Only flush and close if open succeeded. */
	if (mine->fd >= 0) {
		/*
		 * Sometimes, we should flush the input before closing.
		 *   Regular files: faster to just close without flush.
		 *   Disk-like devices:  Ditto.
		 *   Tapes: must not flush (user might need to
		 *      read the "next" item on a non-rewind device).
		 *   Pipes and sockets:  must flush (otherwise, the
		 *      program feeding the pipe or socket may complain).
		 * Here, I flush everything except for regular files and
		 * device nodes.
		 */
		if (!S_ISREG(mine->st_mode)
		    && !S_ISCHR(mine->st_mode)
		    && !S_ISBLK(mine->st_mode)) {
			ssize_t bytesRead;
			do {
				bytesRead = read(mine->fd, mine->buffer,
				    mine->block_size);
			} while (bytesRead > 0);
		}
		/* If a named file was opened, then it needs to be closed. */
		if (mine->filename_type != FNT_STDIN)
			close(mine->fd);
	}
	free(mine->buffer);
	mine->buffer = NULL;
	mine->fd = -1;
	return (ARCHIVE_OK);
}